

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O3

void __thiscall Alice::RunGCProtocol(Alice *this)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  if ((this->super_Party).termination_condition == false) {
    uVar3 = 0;
    do {
      printf("Alice: pc # %d = %ld\n",uVar3,(this->super_Party).pc);
      ObliviousExecute(this);
      ObliviousShuffle(this);
      ObliviousTranslate(this);
      uVar3 = (ulong)((int)uVar3 + 1);
    } while ((this->super_Party).termination_condition != true);
  }
  lVar2 = std::chrono::_V2::system_clock::now();
  printf("Alice: Program Output = %ld\n",(this->super_Party).output);
  printf("Execution Time = %ld microseconds\n",(lVar2 - lVar1) / 1000);
  return;
}

Assistant:

void Alice::RunGCProtocol()
{
    int count = 0;
    auto start = std::chrono::high_resolution_clock::now();
    while(!termination_condition)
    {
        printf("Alice: pc # %d = %ld\n", count++, pc);
        ObliviousExecute();
        ObliviousShuffle();
        ObliviousTranslate();
    }
    auto stop = std::chrono::high_resolution_clock::now(); 
    auto duration = std::chrono::duration_cast<std::chrono::microseconds>(stop - start);   
    printf("Alice: Program Output = %ld\n", output);   
    printf("Execution Time = %ld microseconds\n", duration.count()); 

}